

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O1

int Emb_ManComputeDistance_old(Emb_Man_t *p,Emb_Obj_t *pPivot)

{
  uint *puVar1;
  Vec_Int_t *pVVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Int_t *__ptr;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int *local_40;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(4000);
  p_00->pArray = piVar4;
  __ptr = (Vec_Int_t *)malloc(0x10);
  __ptr->nCap = 1000;
  __ptr->nSize = 0;
  piVar4 = (int *)malloc(4000);
  __ptr->pArray = piVar4;
  uVar3 = p->nTravIds + 1;
  p->nTravIds = uVar3;
  (pPivot->field_7).TravId = uVar3;
  Vec_IntPush(p_00,pPivot->hHandle);
  if (p_00->nSize < 1) {
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    pVVar2 = p_00;
    do {
      p_00 = __ptr;
      __ptr = pVVar2;
      local_40 = &__ptr->nSize;
      p_00->nSize = 0;
      if (0 < __ptr->nSize) {
        lVar8 = 0;
        do {
          if (p->pObjData == (int *)0x0) break;
          puVar1 = (uint *)(p->pObjData + (uint)__ptr->pArray[lVar8]);
          if (0xf < *puVar1) {
            uVar7 = 0;
            do {
              lVar5 = (long)(int)puVar1[uVar7 + 5];
              if (puVar1[3 - lVar5] != p->nTravIds) {
                puVar1[3 - lVar5] = p->nTravIds;
                Vec_IntPush(p_00,puVar1[2 - lVar5]);
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 < *puVar1 >> 4);
          }
          if (0 < (int)puVar1[1]) {
            lVar5 = 0;
            do {
              lVar6 = (long)(int)puVar1[(ulong)(*puVar1 >> 4) + lVar5 + 5];
              if (puVar1[lVar6 + 3] != p->nTravIds) {
                puVar1[lVar6 + 3] = p->nTravIds;
                Vec_IntPush(p_00,puVar1[lVar6 + 2]);
              }
              lVar5 = lVar5 + 1;
            } while ((int)lVar5 < (int)puVar1[1]);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < *local_40);
      }
      iVar9 = iVar9 + 1;
      pVVar2 = p_00;
    } while (0 < p_00->nSize);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  if (p_00 != (Vec_Int_t *)0x0) {
    free(p_00);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  return iVar9;
}

Assistant:

int Emb_ManComputeDistance_old( Emb_Man_t * p, Emb_Obj_t * pPivot )
{
    Vec_Int_t * vThis, * vNext, * vTemp;
    Emb_Obj_t * pThis, * pNext;
    int i, k, d, nVisited = 0;
//    assert( Emb_ObjIsTerm(pPivot) );
    vThis = Vec_IntAlloc( 1000 );
    vNext = Vec_IntAlloc( 1000 );
    Emb_ManIncrementTravId( p );
    Emb_ObjSetTravIdCurrent( p, pPivot );
    Vec_IntPush( vThis, pPivot->hHandle );
    for ( d = 0; Vec_IntSize(vThis) > 0; d++ )
    {
        nVisited += Vec_IntSize(vThis);
        Vec_IntClear( vNext );
        Emb_ManForEachObjVec( vThis, p, pThis, i )
        {
            Emb_ObjForEachFanin( pThis, pNext, k )
            {
                if ( Emb_ObjIsTravIdCurrent(p, pNext) )
                    continue;
                Emb_ObjSetTravIdCurrent(p, pNext);
                Vec_IntPush( vNext, pNext->hHandle );
                nVisited += !Emb_ObjIsTerm(pNext);
            }
            Emb_ObjForEachFanout( pThis, pNext, k )
            {
                if ( Emb_ObjIsTravIdCurrent(p, pNext) )
                    continue;
                Emb_ObjSetTravIdCurrent(p, pNext);
                Vec_IntPush( vNext, pNext->hHandle );
                nVisited += !Emb_ObjIsTerm(pNext);
            }
        }
        vTemp = vThis; vThis = vNext; vNext = vTemp;
    }
    Vec_IntFree( vThis );
    Vec_IntFree( vNext );
    // check if there are several strongly connected components
//    if ( nVisited < Emb_ManNodeNum(p) )
//        printf( "Visited less nodes (%d) than present (%d).\n", nVisited, Emb_ManNodeNum(p) );
    return d;
}